

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  float *pfVar3;
  undefined4 uVar4;
  float fVar5;
  unsigned_long uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  SubGridBuildData *pSVar8;
  MutexSys *pMVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  MutexSys *pMVar19;
  char *pcVar20;
  float *pfVar21;
  long lVar22;
  size_t sVar23;
  uint uVar24;
  char *pcVar25;
  size_t i;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint y [4];
  uint geomIDs [4];
  uint x [4];
  AABBNode node;
  uint primID [4];
  BBox3fa bounds [4];
  MutexSys *local_200 [2];
  float local_1f0 [4];
  ThreadLocal2 *local_1e0 [3];
  BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *local_1c8;
  Lock<embree::MutexSys> local_1c0 [2];
  undefined4 local_1a0 [36];
  uint auStack_110 [4];
  Lock<embree::MutexSys> local_100;
  undefined4 auStack_f0 [48];
  
  local_1c8 = this;
  uVar6 = set->_begin;
  uVar27 = set->_end - uVar6;
  pfVar21 = prims[uVar6].lower.field_0.m128 + 3;
  local_1f0[0] = *pfVar21;
  uVar24 = 1;
  for (uVar26 = 1; uVar29 = (ulong)uVar24, uVar26 < uVar27; uVar26 = uVar26 + 1) {
    fVar5 = pfVar21[uVar26 * 8];
    uVar28 = 0;
    do {
      if (uVar29 == uVar28) {
        uVar24 = uVar24 + 1;
        local_1f0[uVar29] = fVar5;
        break;
      }
      pfVar3 = local_1f0 + uVar28;
      uVar28 = uVar28 + 1;
    } while (fVar5 != *pfVar3);
  }
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  local_200[0] = (MutexSys *)(uVar29 * 0x58);
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_100.locked = true;
    local_100.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_01->alloc0).end = auVar33._0_8_;
    (this_01->alloc0).allocBlockSize = auVar33._8_8_;
    (this_01->alloc0).bytesUsed = auVar33._16_8_;
    (this_01->alloc0).bytesWasted = auVar33._24_8_;
    (this_01->alloc0).ptr = (char *)auVar33._0_8_;
    (this_01->alloc0).cur = auVar33._8_8_;
    (this_01->alloc0).end = auVar33._16_8_;
    (this_01->alloc0).allocBlockSize = auVar33._24_8_;
    auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = auVar33._0_8_;
      (this_01->alloc1).allocBlockSize = auVar33._8_8_;
      (this_01->alloc1).bytesUsed = auVar33._16_8_;
      (this_01->alloc1).bytesWasted = auVar33._24_8_;
      (this_01->alloc1).ptr = (char *)auVar33._0_8_;
      (this_01->alloc1).cur = auVar33._8_8_;
      (this_01->alloc1).end = auVar33._16_8_;
      (this_01->alloc1).allocBlockSize = auVar33._24_8_;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)auVar33._0_8_;
      (this_01->alloc1).cur = auVar33._8_8_;
      (this_01->alloc1).end = auVar33._16_8_;
      (this_01->alloc1).allocBlockSize = auVar33._24_8_;
      (this_01->alloc1).end = auVar33._0_8_;
      (this_01->alloc1).allocBlockSize = auVar33._8_8_;
      (this_01->alloc1).bytesUsed = auVar33._16_8_;
      (this_01->alloc1).bytesWasted = auVar33._24_8_;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_1c0[0].mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_1c0[0].locked = true;
    local_1e0[0] = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,local_1e0);
    Lock<embree::MutexSys>::~Lock(local_1c0);
    Lock<embree::MutexSys>::~Lock(&local_100);
  }
  pMVar19 = local_200[0];
  pTVar7->bytesUsed = (long)&local_200[0]->mutex + pTVar7->bytesUsed;
  sVar23 = pTVar7->cur;
  uVar28 = (ulong)(-(int)sVar23 & 0xf);
  uVar26 = (long)&local_200[0]->mutex + uVar28 + sVar23;
  pTVar7->cur = uVar26;
  if (pTVar7->end < uVar26) {
    pTVar7->cur = sVar23;
    pMVar9 = (MutexSys *)pTVar7->allocBlockSize;
    if ((MutexSys *)((long)local_200[0] * 4) < pMVar9 || (long)local_200[0] * 4 - (long)pMVar9 == 0)
    {
      local_1c0[0].mutex = pMVar9;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_1c0);
      pTVar7->ptr = pcVar20;
      sVar23 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar23;
      pTVar7->end = (size_t)local_1c0[0].mutex;
      pTVar7->cur = (size_t)pMVar19;
      if (local_1c0[0].mutex < pMVar19) {
        pTVar7->cur = 0;
        local_1c0[0].mutex = (MutexSys *)pTVar7->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_1c0);
        pTVar7->ptr = pcVar20;
        sVar23 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar23;
        pTVar7->end = (size_t)local_1c0[0].mutex;
        pTVar7->cur = (size_t)pMVar19;
        if (local_1c0[0].mutex < pMVar19) {
          pTVar7->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_00c5645a;
        }
      }
      pTVar7->bytesWasted = sVar23;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_200);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar28;
    pcVar20 = pTVar7->ptr + (uVar26 - (long)local_200[0]);
  }
LAB_00c5645a:
  auVar40 = ZEXT816(0) << 0x40;
  auVar39._8_4_ = 0x7f800000;
  auVar39._0_8_ = 0x7f8000007f800000;
  auVar39._12_4_ = 0x7f800000;
  pcVar25 = pcVar20;
  for (uVar26 = 0; uVar26 != uVar29; uVar26 = uVar26 + 1) {
    pSVar8 = (local_1c8->createLeafFunc).sgrids;
    uVar30 = 0;
    pfVar21 = prims[uVar6].upper.field_0.m128 + 3;
    uVar28 = uVar27;
    while( true ) {
      bVar31 = uVar28 == 0;
      uVar28 = uVar28 - 1;
      if (bVar31) break;
      if (pfVar21[-4] == local_1f0[uVar26]) {
        fVar5 = *pfVar21;
        *(uint *)((long)local_1e0 + uVar30 * 4) = (uint)pSVar8[(uint)fVar5].sx;
        local_1f0[uVar30 - 4] = (float)(uint)pSVar8[(uint)fVar5].sy;
        auStack_110[uVar30] = pSVar8[(uint)fVar5].primID;
        *(undefined1 (*) [32])(auStack_f0 + uVar30 * 8 + -4) = *(undefined1 (*) [32])(pfVar21 + -7);
        uVar30 = (ulong)((int)uVar30 + 1);
      }
      pfVar21 = pfVar21 + 8;
    }
    fVar5 = local_1f0[uVar26];
    for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
      pcVar2 = pcVar25 + lVar22 * 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = -1;
      pcVar2[5] = -1;
      pcVar2[6] = -1;
      pcVar2[7] = -1;
    }
    for (lVar22 = 0x30; lVar22 != 0x34; lVar22 = lVar22 + 1) {
      pcVar25[lVar22] = -1;
      pcVar25[lVar22 + -8] = -1;
      pcVar25[lVar22 + -0x10] = -1;
    }
    for (lVar22 = 0x34; lVar22 != 0x38; lVar22 = lVar22 + 1) {
      pcVar25[lVar22] = '\0';
      pcVar25[lVar22 + -8] = '\0';
      pcVar25[lVar22 + -0x10] = '\0';
    }
    *(float *)(pcVar20 + uVar26 * 0x58 + 0x50) = fVar5;
    local_1a0[0x10] = 0x7f800000;
    local_1a0[0x11] = 0x7f800000;
    local_1a0[0x12] = 0x7f800000;
    local_1a0[0x13] = 0x7f800000;
    local_1a0[8] = 0x7f800000;
    local_1a0[9] = 0x7f800000;
    local_1a0[10] = 0x7f800000;
    local_1a0[0xb] = 0x7f800000;
    local_1a0[0] = 0x7f800000;
    local_1a0[1] = 0x7f800000;
    local_1a0[2] = 0x7f800000;
    local_1a0[3] = 0x7f800000;
    local_1a0[0x14] = 0xff800000;
    local_1a0[0x15] = 0xff800000;
    local_1a0[0x16] = 0xff800000;
    local_1a0[0x17] = 0xff800000;
    local_1a0[0xc] = 0xff800000;
    local_1a0[0xd] = 0xff800000;
    local_1a0[0xe] = 0xff800000;
    local_1a0[0xf] = 0xff800000;
    local_1a0[4] = 0xff800000;
    local_1a0[5] = 0xff800000;
    local_1a0[6] = 0xff800000;
    local_1a0[7] = 0xff800000;
    for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
      (&local_1c0[0].mutex)[lVar22] = (MutexSys *)0x8;
    }
    for (lVar22 = 0; uVar30 << 2 != lVar22; lVar22 = lVar22 + 4) {
      *(ulong *)(pcVar25 + lVar22 * 2) =
           CONCAT44(*(undefined4 *)((long)auStack_110 + lVar22),
                    *(int *)((long)local_200 + lVar22) << 0x10 |
                    (uint)*(ushort *)((long)local_1e0 + lVar22));
      uVar4 = auStack_f0[lVar22 * 2 + -3];
      *(undefined4 *)((long)local_1a0 + lVar22) = auStack_f0[lVar22 * 2 + -4];
      *(undefined4 *)((long)local_1a0 + lVar22 + 0x20) = uVar4;
      *(undefined4 *)((long)local_1a0 + lVar22 + 0x40) = auStack_f0[lVar22 * 2 + -2];
      *(undefined4 *)((long)local_1a0 + lVar22 + 0x10) = auStack_f0[lVar22 * 2];
      *(undefined4 *)((long)local_1a0 + lVar22 + 0x30) = auStack_f0[lVar22 * 2 + 1];
      *(undefined4 *)((long)local_1a0 + lVar22 + 0x50) = auStack_f0[lVar22 * 2 + 2];
    }
    auVar14._4_4_ = local_1a0[1];
    auVar14._0_4_ = local_1a0[0];
    auVar14._8_4_ = local_1a0[2];
    auVar14._12_4_ = local_1a0[3];
    auVar15._4_4_ = local_1a0[5];
    auVar15._0_4_ = local_1a0[4];
    auVar15._8_4_ = local_1a0[6];
    auVar15._12_4_ = local_1a0[7];
    auVar42 = vshufps_avx(auVar14,auVar14,0xb1);
    auVar42 = vminps_avx(auVar42,auVar14);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar10 = vminps_avx(auVar11,auVar42);
    auVar42 = vshufps_avx(auVar15,auVar15,0xb1);
    auVar42 = vmaxps_avx(auVar42,auVar15);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vmaxss_avx(auVar11,auVar42);
    fVar5 = (auVar42._0_4_ - auVar10._0_4_) * 1.0000002;
    auVar42 = vcmpss_avx(ZEXT416((uint)(fVar5 / 255.0)),auVar40,0);
    auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar42);
    auVar42 = vcmpss_avx(auVar40,ZEXT416((uint)fVar5),1);
    auVar42 = vandps_avx(auVar42,ZEXT416((uint)(255.0 / fVar5)));
    auVar43 = vshufps_avx(auVar10,auVar10,0);
    auVar35 = vsubps_avx(auVar14,auVar43);
    auVar12 = vshufps_avx(auVar42,auVar42,0);
    auVar46._0_4_ = auVar35._0_4_ * auVar12._0_4_;
    auVar46._4_4_ = auVar35._4_4_ * auVar12._4_4_;
    auVar46._8_4_ = auVar35._8_4_ * auVar12._8_4_;
    auVar46._12_4_ = auVar35._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar46,1);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar36 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
    auVar42 = vsubps_avx(auVar15,auVar43);
    auVar41._0_4_ = auVar42._0_4_ * auVar12._0_4_;
    auVar41._4_4_ = auVar42._4_4_ * auVar12._4_4_;
    auVar41._8_4_ = auVar42._8_4_ * auVar12._8_4_;
    auVar41._12_4_ = auVar42._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar41,2);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar32._8_4_ = 0xff;
    auVar32._0_8_ = 0xff000000ff;
    auVar32._12_4_ = 0xff;
    auVar41 = vpminsd_avx(auVar42,auVar32);
    auVar42 = vcvtdq2ps_avx(auVar36);
    auVar13 = vshufps_avx(auVar11,auVar11,0);
    auVar35 = vcvtdq2ps_avx(auVar41);
    auVar12 = vcmpps_avx(auVar14,auVar39,4);
    auVar47._0_4_ = auVar43._0_4_ + auVar42._0_4_ * auVar13._0_4_;
    auVar47._4_4_ = auVar43._4_4_ + auVar42._4_4_ * auVar13._4_4_;
    auVar47._8_4_ = auVar43._8_4_ + auVar42._8_4_ * auVar13._8_4_;
    auVar47._12_4_ = auVar43._12_4_ + auVar42._12_4_ * auVar13._12_4_;
    auVar34._0_4_ = auVar43._0_4_ + auVar13._0_4_ * auVar35._0_4_;
    auVar34._4_4_ = auVar43._4_4_ + auVar13._4_4_ * auVar35._4_4_;
    auVar34._8_4_ = auVar43._8_4_ + auVar13._8_4_ * auVar35._8_4_;
    auVar34._12_4_ = auVar43._12_4_ + auVar13._12_4_ * auVar35._12_4_;
    auVar42 = vcmpps_avx(auVar47,auVar14,6);
    auVar42 = vpaddd_avx(auVar36,auVar42);
    auVar35 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
    auVar42 = vcmpps_avx(auVar34,auVar15,1);
    auVar42 = vpsubd_avx(auVar41,auVar42);
    auVar36 = vpminsd_avx(auVar42,auVar32);
    auVar42 = vblendvps_avx(auVar32,auVar35,auVar12);
    auVar35 = vpackusdw_avx(auVar42,auVar42);
    auVar42 = vandps_avx(auVar12,auVar36);
    auVar42 = vpackusdw_avx(auVar42,auVar42);
    auVar42 = vpackuswb_avx(auVar35,auVar42);
    auVar42 = vpshufd_avx(auVar42,0xd8);
    *(long *)(pcVar20 + uVar26 * 0x58 + 0x20) = auVar42._0_8_;
    *(float *)(pcVar20 + uVar26 * 0x58 + 0x38) = auVar10._0_4_;
    *(int *)(pcVar20 + uVar26 * 0x58 + 0x44) = auVar11._0_4_;
    auVar16._4_4_ = local_1a0[9];
    auVar16._0_4_ = local_1a0[8];
    auVar16._8_4_ = local_1a0[10];
    auVar16._12_4_ = local_1a0[0xb];
    auVar17._4_4_ = local_1a0[0xd];
    auVar17._0_4_ = local_1a0[0xc];
    auVar17._8_4_ = local_1a0[0xe];
    auVar17._12_4_ = local_1a0[0xf];
    auVar42 = vshufps_avx(auVar16,auVar16,0xb1);
    auVar42 = vminps_avx(auVar42,auVar16);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar10 = vminps_avx(auVar11,auVar42);
    auVar42 = vshufps_avx(auVar17,auVar17,0xb1);
    auVar42 = vmaxps_avx(auVar42,auVar17);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vmaxss_avx(auVar11,auVar42);
    fVar5 = (auVar42._0_4_ - auVar10._0_4_) * 1.0000002;
    auVar42 = vcmpss_avx(ZEXT416((uint)(fVar5 / 255.0)),auVar40,0);
    auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar42);
    auVar42 = vcmpss_avx(auVar40,ZEXT416((uint)fVar5),1);
    auVar42 = vandps_avx(auVar42,ZEXT416((uint)(255.0 / fVar5)));
    auVar43 = vshufps_avx(auVar10,auVar10,0);
    auVar35 = vsubps_avx(auVar16,auVar43);
    auVar12 = vshufps_avx(auVar42,auVar42,0);
    auVar42._0_4_ = auVar35._0_4_ * auVar12._0_4_;
    auVar42._4_4_ = auVar35._4_4_ * auVar12._4_4_;
    auVar42._8_4_ = auVar35._8_4_ * auVar12._8_4_;
    auVar42._12_4_ = auVar35._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar42,1);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar36 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
    auVar42 = vsubps_avx(auVar17,auVar43);
    auVar35._0_4_ = auVar42._0_4_ * auVar12._0_4_;
    auVar35._4_4_ = auVar42._4_4_ * auVar12._4_4_;
    auVar35._8_4_ = auVar42._8_4_ * auVar12._8_4_;
    auVar35._12_4_ = auVar42._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar35,2);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar41 = vpminsd_avx(auVar42,auVar32);
    auVar42 = vcvtdq2ps_avx(auVar36);
    auVar13 = vshufps_avx(auVar11,auVar11,0);
    auVar35 = vcvtdq2ps_avx(auVar41);
    auVar12 = vcmpps_avx(auVar16,auVar39,4);
    auVar44._0_4_ = auVar13._0_4_ * auVar42._0_4_ + auVar43._0_4_;
    auVar44._4_4_ = auVar13._4_4_ * auVar42._4_4_ + auVar43._4_4_;
    auVar44._8_4_ = auVar13._8_4_ * auVar42._8_4_ + auVar43._8_4_;
    auVar44._12_4_ = auVar13._12_4_ * auVar42._12_4_ + auVar43._12_4_;
    auVar37._0_4_ = auVar13._0_4_ * auVar35._0_4_ + auVar43._0_4_;
    auVar37._4_4_ = auVar13._4_4_ * auVar35._4_4_ + auVar43._4_4_;
    auVar37._8_4_ = auVar13._8_4_ * auVar35._8_4_ + auVar43._8_4_;
    auVar37._12_4_ = auVar13._12_4_ * auVar35._12_4_ + auVar43._12_4_;
    auVar42 = vcmpps_avx(auVar44,auVar16,6);
    auVar42 = vpaddd_avx(auVar36,auVar42);
    auVar35 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
    auVar42 = vcmpps_avx(auVar37,auVar17,1);
    auVar42 = vpsubd_avx(auVar41,auVar42);
    auVar36 = vpminsd_avx(auVar42,auVar32);
    auVar42 = vblendvps_avx(auVar32,auVar35,auVar12);
    auVar35 = vpackusdw_avx(auVar42,auVar42);
    auVar42 = vandps_avx(auVar12,auVar36);
    auVar42 = vpackusdw_avx(auVar42,auVar42);
    auVar42 = vpackuswb_avx(auVar35,auVar42);
    auVar42 = vpshufd_avx(auVar42,0xd8);
    *(long *)(pcVar20 + uVar26 * 0x58 + 0x28) = auVar42._0_8_;
    *(float *)(pcVar20 + uVar26 * 0x58 + 0x3c) = auVar10._0_4_;
    *(int *)(pcVar20 + uVar26 * 0x58 + 0x48) = auVar11._0_4_;
    auVar13._4_4_ = local_1a0[0x11];
    auVar13._0_4_ = local_1a0[0x10];
    auVar13._8_4_ = local_1a0[0x12];
    auVar13._12_4_ = local_1a0[0x13];
    auVar18._4_4_ = local_1a0[0x15];
    auVar18._0_4_ = local_1a0[0x14];
    auVar18._8_4_ = local_1a0[0x16];
    auVar18._12_4_ = local_1a0[0x17];
    auVar42 = vshufps_avx(auVar13,auVar13,0xb1);
    auVar42 = vminps_avx(auVar42,auVar13);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar35 = vminps_avx(auVar11,auVar42);
    auVar42 = vshufps_avx(auVar18,auVar18,0xb1);
    auVar42 = vmaxps_avx(auVar42,auVar18);
    auVar11 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vmaxss_avx(auVar11,auVar42);
    fVar5 = (auVar42._0_4_ - auVar35._0_4_) * 1.0000002;
    auVar42 = vcmpss_avx(ZEXT416((uint)(fVar5 / 255.0)),auVar40,0);
    auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar42);
    auVar42 = vcmpss_avx(auVar40,ZEXT416((uint)fVar5),1);
    auVar42 = vandps_avx(auVar42,ZEXT416((uint)(255.0 / fVar5)));
    auVar41 = vshufps_avx(auVar35,auVar35,0);
    auVar10 = vsubps_avx(auVar13,auVar41);
    auVar12 = vshufps_avx(auVar42,auVar42,0);
    auVar43._0_4_ = auVar10._0_4_ * auVar12._0_4_;
    auVar43._4_4_ = auVar10._4_4_ * auVar12._4_4_;
    auVar43._8_4_ = auVar10._8_4_ * auVar12._8_4_;
    auVar43._12_4_ = auVar10._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar43,1);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar10 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
    auVar42 = vsubps_avx(auVar18,auVar41);
    auVar36._0_4_ = auVar42._0_4_ * auVar12._0_4_;
    auVar36._4_4_ = auVar42._4_4_ * auVar12._4_4_;
    auVar36._8_4_ = auVar42._8_4_ * auVar12._8_4_;
    auVar36._12_4_ = auVar42._12_4_ * auVar12._12_4_;
    auVar42 = vroundps_avx(auVar36,2);
    auVar42 = vcvtps2dq_avx(auVar42);
    auVar36 = vpminsd_avx(auVar42,auVar32);
    auVar42 = vcvtdq2ps_avx(auVar10);
    auVar43 = vshufps_avx(auVar11,auVar11,0);
    auVar12 = vcvtdq2ps_avx(auVar36);
    auVar45._0_4_ = auVar43._0_4_ * auVar42._0_4_ + auVar41._0_4_;
    auVar45._4_4_ = auVar43._4_4_ * auVar42._4_4_ + auVar41._4_4_;
    auVar45._8_4_ = auVar43._8_4_ * auVar42._8_4_ + auVar41._8_4_;
    auVar45._12_4_ = auVar43._12_4_ * auVar42._12_4_ + auVar41._12_4_;
    auVar38._0_4_ = auVar43._0_4_ * auVar12._0_4_ + auVar41._0_4_;
    auVar38._4_4_ = auVar43._4_4_ * auVar12._4_4_ + auVar41._4_4_;
    auVar38._8_4_ = auVar43._8_4_ * auVar12._8_4_ + auVar41._8_4_;
    auVar38._12_4_ = auVar43._12_4_ * auVar12._12_4_ + auVar41._12_4_;
    auVar42 = vcmpps_avx(auVar45,auVar13,6);
    auVar12 = vpaddd_avx(auVar10,auVar42);
    auVar42 = vcmpps_avx(auVar38,auVar18,1);
    auVar10 = vpsubd_avx(auVar36,auVar42);
    auVar42 = vcmpps_avx(auVar13,auVar39,4);
    auVar12 = vpmaxsd_avx(auVar12,(undefined1  [16])0x0);
    auVar10 = vpminsd_avx(auVar10,auVar32);
    auVar12 = vblendvps_avx(auVar32,auVar12,auVar42);
    auVar42 = vandps_avx(auVar42,auVar10);
    auVar12 = vpackusdw_avx(auVar12,auVar12);
    auVar42 = vpackusdw_avx(auVar42,auVar42);
    auVar42 = vpackuswb_avx(auVar12,auVar42);
    auVar42 = vpshufd_avx(auVar42,0xd8);
    *(long *)(pcVar20 + uVar26 * 0x58 + 0x30) = auVar42._0_8_;
    *(float *)(pcVar20 + uVar26 * 0x58 + 0x40) = auVar35._0_4_;
    *(int *)(pcVar20 + uVar26 * 0x58 + 0x4c) = auVar11._0_4_;
    pcVar25 = pcVar25 + 0x58;
  }
  uVar26 = 7;
  if (uVar29 < 7) {
    uVar26 = uVar29;
  }
  return (NodeRef)(uVar26 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }